

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O1

void Warning(char *message,char *badValueMessage,EWStatus type)

{
  bool bVar1;
  
  if (type == W_PASS03) {
    bVar1 = pass - 1U < 2;
  }
  else if (type == W_PASS3) {
    bVar1 = pass < 3;
  }
  else {
    if (type != W_EARLY) goto LAB_001157d9;
    bVar1 = 2 < pass;
  }
  if (bVar1) {
    return;
  }
LAB_001157d9:
  WarningImpl((char *)0x0,message,badValueMessage,type);
  return;
}

Assistant:

void Warning(const char* message, const char* badValueMessage, EWStatus type) {
	if (isInactiveTypeInCurrentPass(type)) return;
	WarningImpl(nullptr, message, badValueMessage, type);
}